

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O0

mp_int * dsa_gen_k(char *id_string,mp_int *modulus,mp_int *private_key,uchar *digest,int digest_len)

{
  mp_int *r;
  mp_int *n;
  mp_int *r_00;
  ptrlen bytes;
  mp_int *k;
  mp_int *proto_k;
  mp_int *modminus2;
  uchar digest512 [64];
  ssh_hash *h;
  int digest_len_local;
  uchar *digest_local;
  mp_int *private_key_local;
  mp_int *modulus_local;
  char *id_string_local;
  
  digest512._56_8_ = ssh_hash_new(&ssh_sha512);
  BinarySink_put_asciz(((ssh_hash *)digest512._56_8_)->binarysink_,id_string);
  BinarySink_put_mp_ssh2(*(BinarySink **)(digest512._56_8_ + 8),private_key);
  ssh_hash_digest((ssh_hash *)digest512._56_8_,(uchar *)&modminus2);
  ssh_hash_reset((ssh_hash *)digest512._56_8_);
  BinarySink_put_data(*(BinarySink **)(digest512._56_8_ + 8),&modminus2,0x40);
  BinarySink_put_data(*(BinarySink **)(digest512._56_8_ + 8),digest,(long)digest_len);
  ssh_hash_final((ssh_hash *)digest512._56_8_,(uchar *)&modminus2);
  r = mp_copy(modulus);
  mp_sub_integer_into(r,r,2);
  bytes = make_ptrlen(&modminus2,0x40);
  n = mp_from_bytes_be(bytes);
  r_00 = mp_mod(n,r);
  mp_free(n);
  mp_free(r);
  mp_add_integer_into(r_00,r_00,2);
  smemclr(&modminus2,0x40);
  return r_00;
}

Assistant:

mp_int *dsa_gen_k(const char *id_string, mp_int *modulus,
                     mp_int *private_key,
                     unsigned char *digest, int digest_len)
{
    /*
     * The basic DSA signing algorithm is:
     *
     *  - invent a random k between 1 and q-1 (exclusive).
     *  - Compute r = (g^k mod p) mod q.
     *  - Compute s = k^-1 * (hash + x*r) mod q.
     *
     * This has the dangerous properties that:
     *
     *  - if an attacker in possession of the public key _and_ the
     *    signature (for example, the host you just authenticated
     *    to) can guess your k, he can reverse the computation of s
     *    and work out x = r^-1 * (s*k - hash) mod q. That is, he
     *    can deduce the private half of your key, and masquerade
     *    as you for as long as the key is still valid.
     *
     *  - since r is a function purely of k and the public key, if
     *    the attacker only has a _range of possibilities_ for k
     *    it's easy for him to work through them all and check each
     *    one against r; he'll never be unsure of whether he's got
     *    the right one.
     *
     *  - if you ever sign two different hashes with the same k, it
     *    will be immediately obvious because the two signatures
     *    will have the same r, and moreover an attacker in
     *    possession of both signatures (and the public key of
     *    course) can compute k = (hash1-hash2) * (s1-s2)^-1 mod q,
     *    and from there deduce x as before.
     *
     *  - the Bleichenbacher attack on DSA makes use of methods of
     *    generating k which are significantly non-uniformly
     *    distributed; in particular, generating a 160-bit random
     *    number and reducing it mod q is right out.
     *
     * For this reason we must be pretty careful about how we
     * generate our k. Since this code runs on Windows, with no
     * particularly good system entropy sources, we can't trust our
     * RNG itself to produce properly unpredictable data. Hence, we
     * use a totally different scheme instead.
     *
     * What we do is to take a SHA-512 (_big_) hash of the private
     * key x, and then feed this into another SHA-512 hash that
     * also includes the message hash being signed. That is:
     *
     *   proto_k = SHA512 ( SHA512(x) || SHA160(message) )
     *
     * This number is 512 bits long, so reducing it mod q won't be
     * noticeably non-uniform. So
     *
     *   k = proto_k mod q
     *
     * This has the interesting property that it's _deterministic_:
     * signing the same hash twice with the same key yields the
     * same signature.
     *
     * Despite this determinism, it's still not predictable to an
     * attacker, because in order to repeat the SHA-512
     * construction that created it, the attacker would have to
     * know the private key value x - and by assumption he doesn't,
     * because if he knew that he wouldn't be attacking k!
     *
     * (This trick doesn't, _per se_, protect against reuse of k.
     * Reuse of k is left to chance; all it does is prevent
     * _excessively high_ chances of reuse of k due to entropy
     * problems.)
     *
     * Thanks to Colin Plumb for the general idea of using x to
     * ensure k is hard to guess, and to the Cambridge University
     * Computer Security Group for helping to argue out all the
     * fine details.
     */
    ssh_hash *h;
    unsigned char digest512[64];

    /*
     * Hash some identifying text plus x.
     */
    h = ssh_hash_new(&ssh_sha512);
    put_asciz(h, id_string);
    put_mp_ssh2(h, private_key);
    ssh_hash_digest(h, digest512);

    /*
     * Now hash that digest plus the message hash.
     */
    ssh_hash_reset(h);
    put_data(h, digest512, sizeof(digest512));
    put_data(h, digest, digest_len);
    ssh_hash_final(h, digest512);

    /*
     * Now convert the result into a bignum, and coerce it to the
     * range [2,q), which we do by reducing it mod q-2 and adding 2.
     */
    mp_int *modminus2 = mp_copy(modulus);
    mp_sub_integer_into(modminus2, modminus2, 2);
    mp_int *proto_k = mp_from_bytes_be(make_ptrlen(digest512, 64));
    mp_int *k = mp_mod(proto_k, modminus2);
    mp_free(proto_k);
    mp_free(modminus2);
    mp_add_integer_into(k, k, 2);

    smemclr(digest512, sizeof(digest512));

    return k;
}